

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinJoin
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  undefined4 uVar1;
  const_reference pvVar2;
  ostream *poVar3;
  undefined8 uVar4;
  LocationRange *loc_00;
  Frame *pFVar5;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  Interpreter *in_RSI;
  Frame *f;
  stringstream ss_1;
  stringstream ss;
  string *in_stack_fffffffffffffbe8;
  LocationRange *in_stack_fffffffffffffbf0;
  Interpreter *in_stack_fffffffffffffbf8;
  Interpreter *in_stack_fffffffffffffc18;
  string local_3a8 [32];
  stringstream local_388 [16];
  ostream local_378 [383];
  undefined1 local_1f9;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_20;
  Interpreter *local_18;
  AST *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](in_RDX,0);
  if (pvVar2->t != ARRAY) {
    pvVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,0);
    if (pvVar2->t != STRING) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar3 = std::operator<<(local_198,"join first parameter should be string or array, got ");
      std::
      vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
      ::operator[](local_20,0);
      (anonymous_namespace)::type_str_abi_cxx11_((Value *)in_stack_fffffffffffffbe8);
      std::operator<<(poVar3,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      local_1f9 = 1;
      uVar4 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      makeError(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      local_1f9 = 0;
      __cxa_throw(uVar4,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
  }
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_20,1);
  if (pvVar2->t != ARRAY) {
    std::__cxx11::stringstream::stringstream(local_388);
    poVar3 = std::operator<<(local_378,"join second parameter should be array, got ");
    std::
    vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
    ::operator[](local_20,1);
    (anonymous_namespace)::type_str_abi_cxx11_((Value *)in_stack_fffffffffffffbe8);
    std::operator<<(poVar3,local_3a8);
    std::__cxx11::string::~string(local_3a8);
    loc_00 = (LocationRange *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError(local_18,loc_00,in_stack_fffffffffffffbe8);
    __cxa_throw(loc_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  pFVar5 = Stack::top((Stack *)0x22e534);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_20,0);
  if (pvVar2->t == STRING) {
    pFVar5->kind = FRAME_BUILTIN_JOIN_STRINGS;
    pvVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,0);
    uVar1 = *(undefined4 *)&pvVar2->field_0x4;
    (pFVar5->val).t = pvVar2->t;
    *(undefined4 *)&(pFVar5->val).field_0x4 = uVar1;
    (pFVar5->val).v = pvVar2->v;
    pvVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,1);
    uVar1 = *(undefined4 *)&pvVar2->field_0x4;
    (pFVar5->val2).t = pvVar2->t;
    *(undefined4 *)&(pFVar5->val2).field_0x4 = uVar1;
    (pFVar5->val2).v = pvVar2->v;
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    clear((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x22e5c0)
    ;
    pFVar5->first = true;
    pFVar5->elementId = 0;
    local_8 = joinStrings(in_stack_fffffffffffffc18);
  }
  else {
    pFVar5->kind = FRAME_BUILTIN_JOIN_ARRAYS;
    pvVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,0);
    uVar1 = *(undefined4 *)&pvVar2->field_0x4;
    (pFVar5->val).t = pvVar2->t;
    *(undefined4 *)&(pFVar5->val).field_0x4 = uVar1;
    (pFVar5->val).v = pvVar2->v;
    pvVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_20,1);
    uVar1 = *(undefined4 *)&pvVar2->field_0x4;
    (pFVar5->val2).t = pvVar2->t;
    *(undefined4 *)&(pFVar5->val2).field_0x4 = uVar1;
    (pFVar5->val2).v = pvVar2->v;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::clear((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)0x22e65f);
    pFVar5->first = true;
    pFVar5->elementId = 0;
    local_8 = joinArrays(in_stack_fffffffffffffc18);
  }
  return local_8;
}

Assistant:

const AST *builtinJoin(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args[0].t != Value::ARRAY && args[0].t != Value::STRING) {
            std::stringstream ss;
            ss << "join first parameter should be string or array, got " << type_str(args[0]);
            throw makeError(loc, ss.str());
        }
        if (args[1].t != Value::ARRAY) {
            std::stringstream ss;
            ss << "join second parameter should be array, got " << type_str(args[1]);
            throw makeError(loc, ss.str());
        }
        Frame &f = stack.top();
        if (args[0].t == Value::STRING) {
            f.kind = FRAME_BUILTIN_JOIN_STRINGS;
            f.val = args[0];  // sep
            f.val2 = args[1];  // arr
            f.str.clear();
            f.first = true;
            f.elementId = 0;
            return joinStrings();
        } else {
            f.kind = FRAME_BUILTIN_JOIN_ARRAYS;
            f.val = args[0];  // sep
            f.val2 = args[1];  // arr
            f.thunks.clear();
            f.first = true;
            f.elementId = 0;
            return joinArrays();
        }
    }